

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueFloat64::read
          (PLYValueFloat64 *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 uVar1;
  ssize_t sVar2;
  
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)&this->value = uVar1;
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)((long)&this->value + 1) = uVar1;
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)((long)&this->value + 2) = uVar1;
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)((long)&this->value + 3) = uVar1;
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)((long)&this->value + 4) = uVar1;
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)((long)&this->value + 5) = uVar1;
  uVar1 = std::streambuf::sbumpc();
  *(undefined1 *)((long)&this->value + 6) = uVar1;
  sVar2 = std::streambuf::sbumpc();
  *(char *)((long)&this->value + 7) = (char)sVar2;
  return sVar2;
}

Assistant:

void read(std::streambuf *in)
    {
      char *p=reinterpret_cast<char *>(&value);
      p[0]=static_cast<char>(in->sbumpc());
      p[1]=static_cast<char>(in->sbumpc());
      p[2]=static_cast<char>(in->sbumpc());
      p[3]=static_cast<char>(in->sbumpc());
      p[4]=static_cast<char>(in->sbumpc());
      p[5]=static_cast<char>(in->sbumpc());
      p[6]=static_cast<char>(in->sbumpc());
      p[7]=static_cast<char>(in->sbumpc());
    }